

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double calc_kurtosis<float,double>
                 (size_t *ix_arr,size_t st,size_t end,float *x,MissingAction missing_action)

{
  long lVar1;
  size_t *psVar2;
  bool bVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double local_28;
  
  if (missing_action != Fail) {
    if (end < st) {
      return -INFINITY;
    }
    dVar21 = 0.0;
    dVar13 = 0.0;
    dVar14 = 0.0;
    local_28 = 0.0;
    sVar4 = st;
    lVar5 = 0;
    do {
      lVar6 = lVar5;
      if ((uint)ABS(x[ix_arr[sVar4]]) < 0x7f800000) {
        lVar6 = lVar5 + 1;
        auVar17._8_4_ = (int)((ulong)lVar6 >> 0x20);
        auVar17._0_8_ = lVar6;
        auVar17._12_4_ = 0x45300000;
        dVar15 = (auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
        dVar20 = (double)x[ix_arr[sVar4]] - dVar14;
        dVar16 = dVar20 / dVar15;
        auVar19._8_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar19._0_8_ = lVar5;
        auVar19._12_4_ = 0x45300000;
        dVar20 = ((auVar19._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * dVar16 * dVar20;
        dVar21 = dVar21 + dVar16 * -4.0 * dVar13 +
                          dVar16 * dVar16 * 6.0 * local_28 +
                          (dVar15 * dVar15 + dVar15 * -3.0 + 3.0) * dVar16 * dVar16 * dVar20;
        dVar14 = dVar14 + dVar16;
        dVar13 = dVar13 + dVar16 * -3.0 * local_28 + (dVar15 + -2.0) * dVar16 * dVar20;
        local_28 = local_28 + dVar20;
      }
      sVar4 = sVar4 + 1;
      lVar5 = lVar6;
    } while (sVar4 <= end);
    if (lVar6 == 0) {
      return -INFINITY;
    }
    if (((!NAN(local_28)) &&
        ((uint)((long)ABS(local_28) + 0xfff0000000000000U >> 0x35) < 0x3ff && (long)local_28 < 0 ||
         (ABS(local_28) == 0.0 || (long)ABS(local_28) - 1U < 0xfffffffffffff && (long)local_28 < 0))
        ) && (bVar3 = check_more_than_two_unique_values<float>(ix_arr,st,end,x,missing_action),
             !bVar3)) {
      return -INFINITY;
    }
    auVar8._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = 0x45300000;
    auVar22._8_8_ =
         (auVar8._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
    auVar22._0_8_ = dVar21;
    auVar10._8_8_ = local_28;
    auVar10._0_8_ = local_28;
    auVar23 = divpd(auVar22,auVar10);
    dVar13 = auVar23._8_8_ * auVar23._0_8_;
    goto LAB_0025a7b9;
  }
  dVar13 = 0.0;
  dVar14 = 0.0;
  if (end < st) {
LAB_0025a71f:
    dVar21 = ABS(dVar14);
    if ((uint)((long)dVar21 + 0xfff0000000000000U >> 0x35) < 0x3ff && (long)dVar14 < 0 ||
        (dVar21 == 0.0 || (long)dVar21 - 1U < 0xfffffffffffff && (long)dVar14 < 0)) {
      if (end - st < 2) {
        return -INFINITY;
      }
      uVar7 = st + 1;
      do {
        if (end < uVar7) {
          return -INFINITY;
        }
        psVar2 = ix_arr + uVar7;
        uVar7 = uVar7 + 1;
      } while ((x[*psVar2] == x[ix_arr[st]]) && (!NAN(x[*psVar2]) && !NAN(x[ix_arr[st]])));
    }
  }
  else {
    dVar21 = 0.0;
    dVar15 = 0.0;
    lVar5 = 0;
    do {
      lVar6 = lVar5 + 1;
      auVar23._8_4_ = (int)((ulong)lVar6 >> 0x20);
      auVar23._0_8_ = lVar6;
      auVar23._12_4_ = 0x45300000;
      dVar20 = (auVar23._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0);
      dVar18 = ((double)x[ix_arr[st + lVar5]] - dVar15) / dVar20;
      auVar24._8_4_ = (int)((ulong)lVar5 >> 0x20);
      auVar24._0_8_ = lVar5;
      auVar24._12_4_ = 0x45300000;
      dVar16 = ((auVar24._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) * dVar18 *
               ((double)x[ix_arr[st + lVar5]] - dVar15);
      dVar13 = dVar13 + dVar18 * -4.0 * dVar21 +
                        dVar18 * dVar18 * 6.0 * dVar14 +
                        (dVar20 * dVar20 + dVar20 * -3.0 + 3.0) * dVar18 * dVar18 * dVar16;
      dVar15 = dVar15 + dVar18;
      dVar21 = dVar21 + dVar18 * -3.0 * dVar14 + (dVar20 + -2.0) * dVar18 * dVar16;
      dVar14 = dVar16 + dVar14;
      lVar1 = st + lVar5;
      lVar5 = lVar6;
    } while (lVar1 + 1U <= end);
    if (!NAN(dVar14)) goto LAB_0025a71f;
  }
  lVar5 = (end - st) + 1;
  auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar11._0_8_ = lVar5;
  auVar11._12_4_ = 0x45300000;
  auVar12._0_8_ =
       (auVar11._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
  auVar12._8_8_ = dVar13;
  auVar9._8_8_ = dVar14;
  auVar9._0_8_ = dVar14;
  auVar23 = divpd(auVar12,auVar9);
  dVar13 = auVar23._8_8_ * auVar23._0_8_;
LAB_0025a7b9:
  if (0x7fefffffffffffff < (ulong)ABS(dVar13)) {
    return -INFINITY;
  }
  if (dVar13 <= 0.0) {
    return 0.0;
  }
  return dVar13;
}

Assistant:

double calc_kurtosis(size_t ix_arr[], size_t st, size_t end, real_t x[], MissingAction missing_action)
{
    ldouble_safe m = 0;
    ldouble_safe M2 = 0, M3 = 0, M4 = 0;
    ldouble_safe delta, delta_s, delta_div;
    ldouble_safe diff, n;
    ldouble_safe out;

    if (missing_action == Fail)
    {
        for (size_t row = st; row <= end; row++)
        {
            n  =  (ldouble_safe)(row - st + 1);

            delta      =  x[ix_arr[row]] - m;
            delta_div  =  delta / n;
            delta_s    =  delta_div * delta_div;
            diff       =  delta * (delta_div * (ldouble_safe)(row - st));

            m   +=  delta_div;
            M4  +=  diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3;
            M3  +=  diff * delta_div * (n - 2) - 3 * delta_div * M2;
            M2  +=  diff;
        }

        if (unlikely(!is_na_or_inf(M2) && M2 <= 0))
        {
            if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
                return -HUGE_VAL;
        }

        out = ( M4 / M2 ) * ( (ldouble_safe)(end - st + 1) / M2 );
        return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
    }

    else
    {
        size_t cnt = 0;
        for (size_t row = st; row <= end; row++)
        {
            if (likely(!is_na_or_inf(x[ix_arr[row]])))
            {
                cnt++;
                n = (ldouble_safe) cnt;

                delta      =  x[ix_arr[row]] - m;
                delta_div  =  delta / n;
                delta_s    =  delta_div * delta_div;
                diff       =  delta * (delta_div * (ldouble_safe)(cnt - 1));

                m   +=  delta_div;
                M4  +=  diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3;
                M3  +=  diff * delta_div * (n - 2) - 3 * delta_div * M2;
                M2  +=  diff;
            }
        }

        if (unlikely(cnt == 0)) return -HUGE_VAL;
        if (unlikely(!is_na_or_inf(M2) && M2 <= 0))
        {
            if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
                return -HUGE_VAL;
        }

        out = ( M4 / M2 ) * ( (ldouble_safe)cnt / M2 );
        return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
    }
}